

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

double __thiscall ON_Outline::AreaEstimate(ON_Outline *this)

{
  uint uVar1;
  ON_OutlineFigure *this_00;
  double dVar2;
  uint local_28;
  ON__UINT32 i;
  ON__UINT32 figure_count;
  double outline_area;
  ON_Outline *this_local;
  
  if ((this->m_figure_type == SingleStroke) || (this->m_figure_type == DoubleStroke)) {
    this_local = (ON_Outline *)0x0;
  }
  else {
    _i = (ON_Outline *)0x0;
    uVar1 = ON_ClassArray<ON_OutlineFigure>::UnsignedCount(&this->m_figures);
    for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
      this_00 = ON_ClassArray<ON_OutlineFigure>::operator[](&this->m_figures,local_28);
      dVar2 = ON_OutlineFigure::AreaEstimate(this_00);
      _i = (ON_Outline *)(dVar2 + (double)_i);
    }
    this_local = _i;
  }
  return (double)this_local;
}

Assistant:

double ON_Outline::AreaEstimate() const
{
  if (
    ON_OutlineFigure::Type::SingleStroke == m_figure_type
    || ON_OutlineFigure::Type::DoubleStroke == m_figure_type
    )
  {
    return 0.0;
  }

  double outline_area = 0.0;
  const ON__UINT32 figure_count = m_figures.UnsignedCount();
  for (ON__UINT32 i = 0; i < figure_count; i++)
  {
    outline_area += m_figures[i].AreaEstimate();
  }
  return outline_area;
}